

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cdev.cpp
# Opt level: O3

bool __thiscall I2Cdev::writeWords(I2Cdev *this,uint8_t regAddr,uint8_t length,uint16_t *data)

{
  uint __fd;
  int iVar1;
  ssize_t sVar2;
  ulong uVar3;
  undefined7 in_register_00000011;
  int iVar4;
  uint uVar5;
  uint8_t buf [128];
  uint8_t local_a8;
  ushort auStack_a7 [63];
  
  iVar4 = (int)CONCAT71(in_register_00000011,length);
  if (length < 0x40) {
    __fd = open(&(this->super_I2Cgeneric).field_0xd,2);
    if ((int)__fd < 0) {
      writeWords();
    }
    else {
      iVar1 = ioctl(__fd,0x703,(ulong)(byte)(this->super_I2Cgeneric).field_0xc);
      if (iVar1 < 0) {
        writeWords((I2Cdev *)(ulong)__fd);
      }
      else {
        if (length != '\0') {
          uVar3 = 0;
          do {
            auStack_a7[uVar3] = data[uVar3] << 8 | data[uVar3] >> 8;
            uVar3 = uVar3 + 1;
          } while (length != uVar3);
        }
        uVar5 = iVar4 * 2 + 1;
        local_a8 = regAddr;
        sVar2 = write(__fd,&local_a8,(ulong)uVar5);
        if (-1 < (char)sVar2) {
          if ((int)(char)sVar2 != uVar5) {
            fprintf(_stderr,"Short write to device, expected %d, got %d\n",(ulong)(iVar4 + 1));
            close(__fd);
            return false;
          }
          close(__fd);
          return true;
        }
        writeWords();
      }
    }
  }
  else {
    fprintf(_stderr,"Word write count (%d) > 63\n",
            CONCAT71(in_register_00000011,length) & 0xffffffff);
  }
  return false;
}

Assistant:

bool I2Cdev::writeWords(uint8_t regAddr, uint8_t length, uint16_t* data) {
    int8_t count = 0;
    uint8_t buf[128];
    int i, fd;

    // Should do potential byteswap and call writeBytes() really, but that
    // messes with the callers buffer

    if (length > 63) {
        fprintf(stderr, "Word write count (%d) > 63\n", length);
        return(FALSE);
    }

    fd = open(this->i2c_path, O_RDWR);
    if (fd < 0) {
        fprintf(stderr, "Failed to open device: %s\n", strerror(errno));
        return(FALSE);
    }
    if (ioctl(fd, I2C_SLAVE, this->address) < 0) {
        fprintf(stderr, "Failed to select device: %s\n", strerror(errno));
        close(fd);
        return(FALSE);
    }
    buf[0] = regAddr;
    for (i = 0; i < length; i++) {
        buf[i*2+1] = data[i] >> 8;
        buf[i*2+2] = data[i];
    }
    count = write(fd, buf, length*2+1);
    if (count < 0) {
        fprintf(stderr, "Failed to write device(%d): %s\n", count, ::strerror(errno));
        close(fd);
        return(FALSE);
    } else if (count != length*2+1) {
        fprintf(stderr, "Short write to device, expected %d, got %d\n", length+1, count);
        close(fd);
        return(FALSE);
    }
    close(fd);
    return TRUE;
}